

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O3

void * mz_zip_reader_extract_to_heap
                 (mz_zip_archive *pZip,mz_uint file_index,size_t *pSize,mz_uint flags)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  long lVar3;
  void *pBuf;
  ulong buf_size;
  
  if ((((pZip == (mz_zip_archive *)0x0) ||
       (pmVar1 = pZip->m_pState, pmVar1 == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_total_files <= file_index)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    lVar3 = 0;
  }
  else {
    lVar3 = (ulong)*(uint *)((long)(pmVar1->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
            (long)(pmVar1->m_central_dir).m_p;
  }
  if (pSize != (size_t *)0x0) {
    *pSize = 0;
  }
  if (lVar3 != 0) {
    buf_size = (ulong)*(uint *)(lVar3 + 0x14 + (ulong)((flags >> 10 & 1) == 0) * 4);
    pBuf = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,buf_size);
    if (pBuf != (void *)0x0) {
      mVar2 = mz_zip_reader_extract_to_mem_no_alloc
                        (pZip,file_index,pBuf,buf_size,flags,(void *)0x0,0);
      if (mVar2 != 0) {
        if (pSize == (size_t *)0x0) {
          return pBuf;
        }
        *pSize = buf_size;
        return pBuf;
      }
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pBuf);
    }
  }
  return (void *)0x0;
}

Assistant:

void *mz_zip_reader_extract_to_heap(mz_zip_archive *pZip, mz_uint file_index, size_t *pSize, mz_uint flags)
{
    mz_uint64 comp_size, uncomp_size, alloc_size;
    const mz_uint8 *p = mz_zip_get_cdh(pZip, file_index);
    void *pBuf;

    if (pSize)
        *pSize = 0;

    if (!p)
    {
        mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
        return NULL;
    }

    comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
    uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);

    alloc_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? comp_size : uncomp_size;
    if (((sizeof(size_t) == sizeof(mz_uint32))) && (alloc_size > 0x7FFFFFFF))
    {
        mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
        return NULL;
    }

    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)alloc_size)))
    {
        mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        return NULL;
    }

    if (!mz_zip_reader_extract_to_mem(pZip, file_index, pBuf, (size_t)alloc_size, flags))
    {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
        return NULL;
    }

    if (pSize)
        *pSize = (size_t)alloc_size;
    return pBuf;
}